

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int graph_5_4::bfs_2(m_graph g)

{
  code *pcVar1;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < g.vexs[8]; local_c = local_c + 1) {
    *(undefined4 *)(visited + (long)local_c * 4) = 0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int bfs_2(m_graph g) {
        for (int i = 0; i < g.vnum; i++)
            visited[i] = 0;
//        InitQueue(Q);
//        for (int j = 0; j < g.vnum; j++) {
//            if (visited[j] == 0) {
//                visited[j] = 1;
//                visit;
//                EnQueue(Q, j);
//                while (!isEmptyQueue(Q)) {
//                    DeQueue(Q, j);
//                    for (int i = 0; i < g.vnum; i++) {
//                        if (visited[i] == 0 && g.arc[j][i] == 1) {
//                            visited[i] = 1;
//                            visit;
//                            EnQueu(Q, i);
//                        }
//                    }
//                }
//            }
//        }
    }